

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O1

void Abc_TtCountOnesInCofs(word *pTruth,int nVars,int *pStore)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  word *pwVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  uVar1 = (ulong)(uint)nVars;
  if (nVars < 7) {
    if (nVars != 6) {
      uVar2 = 1 << ((byte)nVars & 0x1f);
      uVar6 = ~(-1L << ((byte)uVar2 & 0x3f)) & *pTruth;
      uVar3 = (ulong)uVar2;
      uVar7 = uVar6;
      if ((uint)nVars < 6) {
        do {
          uVar7 = uVar7 | uVar6 << ((byte)uVar3 & 0x3f);
          uVar3 = uVar3 + uVar2;
        } while (uVar3 < 0x40);
      }
      if (*pTruth != uVar7) {
        __assert_fail("*pTruth == nTruth",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                      ,0x137,"void Abc_TtVerifySmallTruth(word *, int)");
      }
    }
    if (0 < nVars) {
      uVar3 = *pTruth;
      lVar8 = 0;
      do {
        uVar7 = *(ulong *)((long)s_Truths6Neg + lVar8) & uVar3;
        uVar7 = uVar7 - (uVar7 >> 1 & 0x5555555555555555);
        uVar7 = (uVar7 >> 2 & 0x3333333333333333) + (uVar7 & 0x3333333333333333);
        uVar7 = (uVar7 >> 4) + uVar7 & 0xf0f0f0f0f0f0f0f;
        uVar7 = (uVar7 >> 8) + uVar7;
        lVar9 = (uVar7 >> 0x10) + uVar7;
        *pStore = (int)((ulong)lVar9 >> 0x20) + (int)lVar9 & 0xff;
        pStore = (int *)((uint *)pStore + 1);
        lVar8 = lVar8 + 8;
      } while (uVar1 << 3 != lVar8);
    }
  }
  else {
    memset(pStore,0,uVar1 * 4);
    if (nVars + -6 != 0x1f) {
      lVar8 = 0;
      do {
        uVar3 = pTruth[lVar8];
        uVar7 = pTruth[lVar8 + 1];
        pwVar5 = s_Truths6Neg;
        lVar9 = 0;
        do {
          uVar6 = (uVar7 & *pwVar5) << ((byte)(1 << ((byte)lVar9 & 0x1f)) & 0x3f) | *pwVar5 & uVar3;
          if (uVar6 != 0) {
            uVar6 = uVar6 - (uVar6 >> 1 & 0x5555555555555555);
            uVar6 = (uVar6 >> 2 & 0x3333333333333333) + (uVar6 & 0x3333333333333333);
            uVar6 = (uVar6 >> 4) + uVar6 & 0xf0f0f0f0f0f0f0f;
            uVar6 = (uVar6 >> 8) + uVar6;
            lVar4 = (uVar6 >> 0x10) + uVar6;
            pStore[lVar9] = pStore[lVar9] + ((int)((ulong)lVar4 >> 0x20) + (int)lVar4 & 0xffU);
          }
          lVar9 = lVar9 + 1;
          pwVar5 = pwVar5 + 1;
        } while (lVar9 != 6);
        uVar3 = pTruth[lVar8];
        if (uVar3 != 0) {
          uVar3 = uVar3 - (uVar3 >> 1 & 0x5555555555555555);
          uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
          uVar3 = (uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f;
          uVar3 = (uVar3 >> 8) + uVar3;
          lVar9 = (uVar3 >> 0x10) + uVar3;
          lVar4 = 0;
          do {
            if (((uint)lVar8 >> ((uint)lVar4 & 0x1f) & 1) == 0) {
              pStore[lVar4 + 6] =
                   pStore[lVar4 + 6] + ((int)((ulong)lVar9 >> 0x20) + (int)lVar9 & 0xffU);
            }
            lVar4 = lVar4 + 1;
          } while (uVar1 - 6 != lVar4);
        }
        uVar3 = pTruth[lVar8 + 1];
        if (uVar3 != 0) {
          uVar3 = uVar3 - (uVar3 >> 1 & 0x5555555555555555);
          uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
          uVar3 = (uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f;
          uVar3 = (uVar3 >> 8) + uVar3;
          lVar9 = (uVar3 >> 0x10) + uVar3;
          lVar4 = 0;
          do {
            if ((((uint)lVar8 | 1) >> ((uint)lVar4 & 0x1f) & 1) == 0) {
              pStore[lVar4 + 6] =
                   pStore[lVar4 + 6] + ((int)((ulong)lVar9 >> 0x20) + (int)lVar9 & 0xffU);
            }
            lVar4 = lVar4 + 1;
          } while (uVar1 - 6 != lVar4);
        }
        lVar8 = lVar8 + 2;
      } while (lVar8 < 1 << ((byte)(nVars + -6) & 0x1f));
    }
  }
  return;
}

Assistant:

static inline void Abc_TtCountOnesInCofs( word * pTruth, int nVars, int * pStore )
{
    word Temp;
    int i, k, Counter, nWords;
    if ( nVars <= 6 )
    {
        Abc_TtVerifySmallTruth(pTruth, nVars);
        for ( i = 0; i < nVars; i++ )
            pStore[i] = Abc_TtCountOnes( pTruth[0] & s_Truths6Neg[i] );
        return;
    }
    assert( nVars > 6 );
    nWords = Abc_TtWordNum( nVars );
    memset( pStore, 0, sizeof(int) * nVars );
    for ( k = 0; k < nWords; k++ )
    {
        // count 1's for the first six variables
        for ( i = 0; i < 6; i++ )
            if ( (Temp = (pTruth[k] & s_Truths6Neg[i]) | ((pTruth[k+1] & s_Truths6Neg[i]) << (1 << i))) )
                pStore[i] += Abc_TtCountOnes( Temp );
        // count 1's for all other variables
        if ( pTruth[k] )
        {
            Counter = Abc_TtCountOnes( pTruth[k] );
            for ( i = 6; i < nVars; i++ )
                if ( (k & (1 << (i-6))) == 0 )
                    pStore[i] += Counter;
        }
        k++;
        // count 1's for all other variables
        if ( pTruth[k] )
        {
            Counter = Abc_TtCountOnes( pTruth[k] );
            for ( i = 6; i < nVars; i++ )
                if ( (k & (1 << (i-6))) == 0 )
                    pStore[i] += Counter;
        }
    } 
}